

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O3

bool __thiscall
QOpenGLExtensions::hasOpenGLExtension(QOpenGLExtensions *this,OpenGLExtension extension)

{
  QOpenGLFunctionsPrivate *pQVar1;
  OpenGLExtension OVar2;
  bool bVar3;
  
  pQVar1 = (this->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
  if (pQVar1 == (QOpenGLFunctionsPrivate *)0x0) {
    bVar3 = false;
  }
  else {
    OVar2 = *(OpenGLExtension *)((long)&pQVar1[2].field_0 + 0x260);
    if (OVar2 == 0xffffffff) {
      OVar2 = qt_gl_resolve_extensions();
      *(OpenGLExtension *)((long)&pQVar1[2].field_0 + 0x260) = OVar2;
    }
    bVar3 = (OVar2 & extension) != 0;
  }
  return bVar3;
}

Assistant:

bool QOpenGLExtensions::hasOpenGLExtension(QOpenGLExtensions::OpenGLExtension extension) const
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return false;
    if (d->m_extensions == -1)
        d->m_extensions = qt_gl_resolve_extensions();
    return (d->m_extensions & int(extension)) != 0;
}